

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int cmd_print(char *arg)

{
  int iVar1;
  int iVar2;
  undefined8 *__ptr;
  char *pcVar3;
  undefined4 extraout_var;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  size_t __size;
  uint uVar6;
  undefined8 *__ptr_00;
  char *local_60;
  undefined4 local_54;
  char *pcStack_50;
  int option_index;
  undefined8 local_48;
  FILE *local_40;
  uint local_38;
  int local_34;
  
  local_40 = _stdout;
  __ptr = (undefined8 *)malloc(0x10);
  pcVar3 = strdup(arg);
  *__ptr = pcVar3;
  strtok(pcVar3," ");
  local_48 = 0;
  pcVar3 = strtok((char *)0x0," ");
  if (pcVar3 == (char *)0x0) {
    uVar6 = 1;
  }
  else {
    __size = 0x18;
    uVar6 = 1;
    __ptr_00 = __ptr;
    do {
      __ptr = (undefined8 *)realloc(__ptr_00,__size);
      if (__ptr == (undefined8 *)0x0) {
        cmd_print_cold_1();
        iVar2 = 1;
        __stream = local_40;
        __ptr = __ptr_00;
        goto LAB_00108261;
      }
      *(char **)((long)__ptr + (__size - 0x10)) = pcVar3;
      pcVar3 = strtok((char *)0x0," ");
      __size = __size + 8;
      uVar6 = uVar6 + 1;
      __ptr_00 = __ptr;
    } while (pcVar3 != (char *)0x0);
  }
  __ptr[uVar6] = 0;
  _optind = 0;
  local_34 = 3;
  local_38 = 0;
  local_60 = (char *)0x0;
  pcStack_50 = (char *)0x0;
switchD_00107fb4_caseD_69:
  do {
    local_54 = 0;
    iVar2 = getopt_long(uVar6,__ptr,"hf:go:guP:L:",cmd_print::long_options,&local_54);
    pcVar3 = _optarg;
    if (0x4f < iVar2) {
      switch(iVar2) {
      case 0x66:
        iVar2 = strcmp(_optarg,"yang");
        local_34 = 1;
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar3,"yin");
          local_34 = 2;
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar3,"tree");
            local_34 = 3;
            if (iVar2 != 0) {
              iVar2 = strcmp(pcVar3,"tree-rfc");
              if (iVar2 == 0) {
                local_38 = local_38 | 1;
                local_34 = 3;
              }
              else {
                iVar2 = strcmp(pcVar3,"info");
                local_34 = 4;
                if (iVar2 != 0) {
                  iVar2 = strcmp(pcVar3,"jsons");
                  local_34 = 5;
                  if (iVar2 != 0) {
                    fprintf(_stderr,"Unknown output format \"%s\".\n",pcVar3);
                    goto LAB_00108255;
                  }
                }
              }
            }
          }
        }
        break;
      case 0x67:
        local_38 = local_38 | 2;
        break;
      case 0x68:
        cmd_print_help();
        iVar2 = 0;
        __stream = local_40;
        goto LAB_00108261;
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
        break;
      case 0x6e:
        local_38 = local_38 | 8;
        break;
      case 0x6f:
        if (pcStack_50 != (char *)0x0) {
          cmd_print_cold_3();
          goto LAB_00108255;
        }
        pcStack_50 = _optarg;
        break;
      default:
        if (iVar2 == 0x50) {
          local_60 = _optarg;
        }
        else if (iVar2 == 0x75) {
          local_38 = local_38 | 4;
        }
      }
      goto switchD_00107fb4_caseD_69;
    }
    if (iVar2 == 0x4c) {
      iVar2 = atoi(_optarg);
      local_48 = CONCAT44(extraout_var,iVar2);
    }
    else {
      if (iVar2 == -1) {
        if (_optind == uVar6) {
          cmd_print_cold_6();
          goto LAB_00108255;
        }
        if (local_34 != 3 && (local_38 != 0 || (int)local_48 != 0)) {
          cmd_print_cold_4();
        }
        pcVar3 = (char *)__ptr[(int)_optind];
        pcVar4 = strchr(pcVar3,0x40);
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
        else {
          *pcVar4 = '\0';
          pcVar4 = pcVar4 + 1;
        }
        lVar5 = ly_ctx_get_module(ctx,pcVar3,pcVar4,0);
        if (lVar5 == 0) {
          lVar5 = ly_ctx_get_submodule(ctx,0,0,pcVar3,pcVar4);
        }
        __stream = local_40;
        if (lVar5 == 0) {
          if (pcVar4 == (char *)0x0) {
            fprintf(_stderr,"No (sub)module \"%s\" found.\n",pcVar3);
          }
          else {
            fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",pcVar3,pcVar4);
          }
          iVar2 = 1;
        }
        else if ((pcStack_50 == (char *)0x0) ||
                (__stream = fopen(pcStack_50,"w"), __stream != (FILE *)0x0)) {
          iVar1 = local_34;
          iVar2 = lys_print_file(__stream,lVar5,local_34,local_60,local_48,local_38);
          if (iVar1 == 5) {
            fputs("\n",__stream);
          }
        }
        else {
          cmd_print_cold_5();
          iVar2 = 1;
          __stream = (FILE *)0x0;
        }
        goto LAB_00108261;
      }
      if (iVar2 == 0x3f) {
        cmd_print_cold_2();
LAB_00108255:
        iVar2 = 1;
        __stream = local_40;
LAB_00108261:
        free((void *)*__ptr);
        free(__ptr);
        if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
          fclose(__stream);
        }
        return iVar2;
      }
    }
  } while( true );
}

Assistant:

int
cmd_print(const char *arg)
{
    int c, argc, option_index, ret = 1, tree_ll = 0, tree_opts = 0;
    char **argv = NULL, *ptr, *target_path = NULL, *model_name, *revision;
    const char *out_path = NULL;
    const struct lys_module *module;
    LYS_OUTFORMAT format = LYS_OUT_TREE;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"output", required_argument, 0, 'o'},
        {"tree-print-groupings", no_argument, 0, 'g'},
        {"tree-print-uses", no_argument, 0, 'u'},
        {"tree-no-leafref-target", no_argument, 0, 'n'},
        {"tree-path", required_argument, 0, 'P'},
        {"info-path", required_argument, 0, 'P'},
        {"tree-line-length", required_argument, 0, 'L'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc+2)*sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "hf:go:guP:L:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_print_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "yang")) {
                format = LYS_OUT_YANG;
            } else if (!strcmp(optarg, "yin")) {
                format = LYS_OUT_YIN;
            } else if (!strcmp(optarg, "tree")) {
                format = LYS_OUT_TREE;
            } else if (!strcmp(optarg, "tree-rfc")) {
                format = LYS_OUT_TREE;
                tree_opts |= LYS_OUTOPT_TREE_RFC;
            } else if (!strcmp(optarg, "info")) {
                format = LYS_OUT_INFO;
            } else if (!strcmp(optarg, "jsons")) {
                format = LYS_OUT_JSON;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'g':
            tree_opts |= LYS_OUTOPT_TREE_GROUPING;
            break;
        case 'u':
            tree_opts |= LYS_OUTOPT_TREE_USES;
            break;
        case 'n':
            tree_opts |= LYS_OUTOPT_TREE_NO_LEAFREF;
            break;
        case 'P':
            target_path = optarg;
            break;
        case 'L':
            tree_ll = atoi(optarg);
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    /* tree fromat with or without gropings */
    if ((tree_opts || tree_ll) && format != LYS_OUT_TREE) {
        fprintf(stderr, "--tree options take effect only in case of the tree output format.\n");
    }

    /* module, revision */
    model_name = argv[optind];
    revision = NULL;
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (!module) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    ret = lys_print_file(output, module, format, target_path, tree_ll, tree_opts);
    if (format == LYS_OUT_JSON) {
        fputs("\n", output);
    }

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    return ret;
}